

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StructUnionTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::StructUnionTypeSyntax_const&>
          (BumpAllocator *this,StructUnionTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  StructUnionTypeSyntax *pSVar8;
  long lVar9;
  Token *pTVar10;
  Token *pTVar11;
  byte bVar12;
  
  bVar12 = 0;
  pSVar8 = (StructUnionTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StructUnionTypeSyntax *)this->endPtr < pSVar8 + 1) {
    pSVar8 = (StructUnionTypeSyntax *)allocateSlow(this,0xe8,8);
  }
  else {
    this->head->current = (byte *)(pSVar8 + 1);
  }
  (pSVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  (pSVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pSVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  pTVar10 = &args->keyword;
  pTVar11 = &pSVar8->keyword;
  for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar5 = pTVar10->field_0x2;
    NVar6.raw = (pTVar10->numFlags).raw;
    uVar7 = pTVar10->rawLen;
    pTVar11->kind = pTVar10->kind;
    pTVar11->field_0x2 = uVar5;
    pTVar11->numFlags = (NumericTokenFlags)NVar6.raw;
    pTVar11->rawLen = uVar7;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar12].info;
    pTVar11 = (Token *)&pTVar11[-(ulong)bVar12].info;
  }
  (pSVar8->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pSVar8->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pSVar8->members).super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->members).
           super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pSVar8->members).super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pSVar8->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cc610
  ;
  uVar5 = (args->closeBrace).field_0x2;
  NVar6.raw = (args->closeBrace).numFlags.raw;
  uVar7 = (args->closeBrace).rawLen;
  pIVar3 = (args->closeBrace).info;
  (pSVar8->closeBrace).kind = (args->closeBrace).kind;
  (pSVar8->closeBrace).field_0x2 = uVar5;
  (pSVar8->closeBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->closeBrace).rawLen = uVar7;
  (pSVar8->closeBrace).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->dimensions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pSVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pSVar8->dimensions).super_SyntaxListBase.childCount =
       (args->dimensions).super_SyntaxListBase.childCount;
  sVar2 = (args->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pSVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->dimensions).
           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  (pSVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pSVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c8638;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }